

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e2ed01::HandleCopyFile
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  CopyResult CVar3;
  int iVar4;
  string *psVar5;
  char *pcVar6;
  static_string_view name;
  static_string_view name_00;
  string_view name_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  size_t sVar7;
  Arguments arguments;
  string err;
  _Any_data local_c8;
  _Manager_type local_b8;
  pointer ppStack_b0;
  pointer local_a8;
  pointer ppStack_a0;
  string newname;
  string oldname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"COPY_FILE must be called with at least two additional arguments",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&err);
    return false;
  }
  std::__cxx11::string::string((string *)&oldname,(string *)(pbVar1 + 1));
  bVar2 = cmsys::SystemTools::FileIsFullPath(&oldname);
  if (!bVar2) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    arguments.InputMayBeRecent = true;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (&err,psVar5,&arguments.InputMayBeRecent,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)&oldname,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
  }
  std::__cxx11::string::string
            ((string *)&newname,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  bVar2 = cmsys::SystemTools::FileIsFullPath(&newname);
  if (!bVar2) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    arguments.InputMayBeRecent = true;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (&err,psVar5,&arguments.InputMayBeRecent,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2);
    std::__cxx11::string::operator=((string *)&newname,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
  }
  if (((anonymous_namespace)::
       HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_a8 = (pointer)0x0;
    ppStack_a0 = (pointer)0x0;
    local_b8 = (_Manager_type)0x0;
    ppStack_b0 = (pointer)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    err.field_2._M_allocated_capacity = 0;
    err.field_2._8_8_ = 0;
    err._M_dataplus._M_p = (pointer)0x0;
    err._M_string_length = 0;
    name.super_string_view._M_str = "INPUT_MAY_BE_RECENT";
    name.super_string_view._M_len = 0x13;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&err,name,0);
    name_00.super_string_view._M_str = "ONLY_IF_DIFFERENT";
    name_00.super_string_view._M_len = 0x11;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&err,name_00,1);
    arguments.Result._M_dataplus._M_p = (pointer)0x0;
    arguments.InputMayBeRecent = true;
    arguments.OnlyIfDifferent = false;
    arguments._2_6_ = 0;
    arguments.Result.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    arguments.Result._M_string_length =
         (size_type)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_manager;
    name_01._M_str = "RESULT";
    name_01._M_len = 6;
    ArgumentParser::Base::Bind((Base *)&err,name_01,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)&HandleCopyFile::parser,(ActionMap *)&err);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&err);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCopyFile::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  err.field_2._M_allocated_capacity = (size_type)&unconsumedArgs;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_40._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3);
  psVar5 = &arguments.Result;
  arguments._0_8_ = arguments._0_8_ & 0xffffffffffff0000;
  arguments.Result._M_dataplus._M_p = (pointer)&arguments.Result.field_2;
  arguments.Result._M_string_length = 0;
  arguments.Result.field_2._M_allocated_capacity =
       arguments.Result.field_2._M_allocated_capacity & 0xffffffffffffff00;
  err._M_dataplus._M_p = (pointer)&HandleCopyFile::parser;
  err._M_string_length = 0;
  err.field_2._8_8_ = &arguments;
  local_c8._0_8_ = 0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  ppStack_b0 = (pointer)0x0;
  local_a8 = (pointer)((ulong)local_a8 & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&err,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_40,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = cmsys::SystemTools::FileIsDirectory(&oldname);
    if (bVar2) {
      if (arguments.Result._M_string_length != 0) {
        pcVar6 = "cannot copy a directory";
        sVar7 = 0x17;
LAB_00331b7c:
        bVar2 = true;
        value._M_str = pcVar6;
        value._M_len = sVar7;
        cmMakefile::AddDefinition(status->Makefile,psVar5,value);
        goto LAB_00331aef;
      }
      cmStrCat<char_const(&)[37],std::__cxx11::string&>
                (&err,(char (*) [37])"COPY_FILE cannot copy a directory\n  ",&oldname);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      bVar2 = cmsys::SystemTools::FileIsDirectory(&newname);
      if (!bVar2) {
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
        CVar3 = cmSystemTools::CopySingleFile
                          (&oldname,&newname,(uint)arguments.OnlyIfDifferent,
                           (uint)arguments.InputMayBeRecent,&err);
        if (CVar3 == Success) {
          bVar2 = true;
          if (arguments.Result._M_string_length != 0) {
            value_01._M_str = "0";
            value_01._M_len = 1;
            cmMakefile::AddDefinition(status->Makefile,psVar5,value_01);
          }
        }
        else if (arguments.Result._M_string_length == 0) {
          cmStrCat<char_const(&)[28],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                    (&local_40,(char (*) [28])"COPY_FILE failed to copy\n  ",&oldname,
                     (char (*) [7])"\nto\n  ",&newname,(char (*) [11])"\nbecause: ",&err,
                     (char (*) [2])0x75c6b6);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_40);
          bVar2 = false;
        }
        else {
          bVar2 = true;
          value_00._M_str = err._M_dataplus._M_p;
          value_00._M_len = err._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,psVar5,value_00);
        }
        std::__cxx11::string::~string((string *)&err);
        goto LAB_00331aef;
      }
      if (arguments.Result._M_string_length != 0) {
        pcVar6 = "cannot copy to a directory";
        sVar7 = 0x1a;
        goto LAB_00331b7c;
      }
      cmStrCat<char_const(&)[40],std::__cxx11::string&>
                (&err,(char (*) [40])"COPY_FILE cannot copy to a directory\n  ",&newname);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    std::operator+(&err,"COPY_FILE unknown argument:\n  ",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&err);
  bVar2 = false;
LAB_00331aef:
  std::__cxx11::string::~string((string *)psVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  std::__cxx11::string::~string((string *)&newname);
  std::__cxx11::string::~string((string *)&oldname);
  return bVar2;
}

Assistant:

bool HandleCopyFile(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("COPY_FILE must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool InputMayBeRecent = false;
    bool OnlyIfDifferent = false;
    std::string Result;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("INPUT_MAY_BE_RECENT"_s, &Arguments::InputMayBeRecent)
      .Bind("ONLY_IF_DIFFERENT"_s, &Arguments::OnlyIfDifferent)
      .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("COPY_FILE unknown argument:\n  " +
                    unconsumedArgs.front());
    return false;
  }

  bool result = true;
  if (cmsys::SystemTools::FileIsDirectory(oldname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy a directory\n  ", oldname));
      result = false;
    }
    return result;
  }
  if (cmsys::SystemTools::FileIsDirectory(newname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy to a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy to a directory\n  ", newname));
      result = false;
    }
    return result;
  }

  cmSystemTools::CopyWhen when;
  if (arguments.OnlyIfDifferent) {
    when = cmSystemTools::CopyWhen::OnlyIfDifferent;
  } else {
    when = cmSystemTools::CopyWhen::Always;
  }
  cmSystemTools::CopyInputRecent const inputRecent = arguments.InputMayBeRecent
    ? cmSystemTools::CopyInputRecent::Yes
    : cmSystemTools::CopyInputRecent::No;

  std::string err;
  if (cmSystemTools::CopySingleFile(oldname, newname, when, inputRecent,
                                    &err) ==
      cmSystemTools::CopyResult::Success) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, "0");
    }
  } else {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
    } else {
      status.SetError(cmStrCat("COPY_FILE failed to copy\n  ", oldname,
                               "\nto\n  ", newname, "\nbecause: ", err, "\n"));
      result = false;
    }
  }

  return result;
}